

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaErr4Line(xmlSchemaAbstractCtxtPtr ctxt,xmlErrorLevel errorLevel,int code,
                      xmlNodePtr node,int line,char *msg,xmlChar *str1,xmlChar *str2,xmlChar *str3,
                      xmlChar *str4)

{
  long lVar1;
  undefined4 in_register_00000084;
  char *file;
  xmlSchemaParserCtxtPtr pctxt;
  int in_stack_ffffffffffffff70;
  int local_58;
  char *f;
  unsigned_long l;
  
  if (ctxt == (xmlSchemaAbstractCtxtPtr)0x0) {
    return;
  }
  if (ctxt->type == 1) {
    xmlSchemaPErrFull((xmlSchemaParserCtxtPtr)ctxt,node,code,errorLevel,
                      (char *)CONCAT44(in_register_00000084,line),(int)msg,str1,str2,str3,
                      in_stack_ffffffffffffff70,msg,str1,str2,str3,str4);
    return;
  }
  if (ctxt->type != 2) {
    return;
  }
  if (line == 0) {
    if ((node == (xmlNodePtr)0x0) &&
       (((*(int *)((long)&ctxt[10].dummy + 4) < 0 || (*(long *)(ctxt + 0xc) == 0)) ||
        (node = *(xmlNodePtr *)(*(long *)(ctxt + 0xc) + 8), node == (xmlNodePtr)0x0)))) {
      if ((*(long *)(ctxt + 5) == 0) || (lVar1 = *(long *)(*(long *)(ctxt + 5) + 0x38), lVar1 == 0))
      {
        line = 0;
        goto LAB_00195949;
      }
      file = *(char **)(lVar1 + 8);
      if (*(long *)(ctxt + 0xc) != 0) {
        line = *(int *)(*(long *)(ctxt + 0xc) + 0x10);
        goto LAB_0019594c;
      }
      line = *(int *)(lVar1 + 0x34);
      local_58 = *(int *)(lVar1 + 0x38);
      goto LAB_00195954;
    }
    line = 0;
    file = (char *)0x0;
    local_58 = 0;
  }
  else {
    if (*(long *)(ctxt + 3) == 0) {
      if ((*(long *)(ctxt + 5) == 0) || (lVar1 = *(long *)(*(long *)(ctxt + 5) + 0x38), lVar1 == 0))
      {
LAB_00195949:
        file = (char *)0x0;
      }
      else {
        file = *(char **)(lVar1 + 8);
      }
    }
    else {
      file = *(char **)(*(long *)(ctxt + 3) + 0x88);
    }
LAB_0019594c:
    local_58 = 0;
LAB_00195954:
    node = (xmlNodePtr)0x0;
  }
  if (*(code **)(ctxt + 0x15) != (code *)0x0) {
    if ((file != (char *)0x0) && (line != 0)) goto LAB_001959b6;
    (**(code **)(ctxt + 0x15))(ctxt[0x15].dummy,&f,&l);
    if (file == (char *)0x0) {
      file = f;
    }
    if (line == 0) {
      line = (int)l;
    }
  }
  if (file == (char *)0x0) {
    file = *(char **)(ctxt + 6);
  }
LAB_001959b6:
  xmlSchemaVErrFull((xmlSchemaValidCtxtPtr)ctxt,node,code,errorLevel,file,line,str1,str2,str3,
                    local_58,msg,str1,str2,str3,str4);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(6,0)
xmlSchemaErr4Line(xmlSchemaAbstractCtxtPtr ctxt,
		  xmlErrorLevel errorLevel,
		  int code, xmlNodePtr node, int line, const char *msg,
		  const xmlChar *str1, const xmlChar *str2,
		  const xmlChar *str3, const xmlChar *str4)
{
    if (ctxt != NULL) {
	if (ctxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctxt;
	    const char *file = NULL;
	    int col = 0;

	    /*
	    * Error node. If we specify a line number, then
	    * do not channel any node to the error function.
	    */
	    if (line == 0) {
		if ((node == NULL) &&
		    (vctxt->depth >= 0) &&
		    (vctxt->inode != NULL)) {
		    node = vctxt->inode->node;
		}
		/*
		* Get filename and line if no node-tree.
		*/
		if ((node == NULL) &&
		    (vctxt->parserCtxt != NULL) &&
		    (vctxt->parserCtxt->input != NULL)) {
		    file = vctxt->parserCtxt->input->filename;
                    if (vctxt->inode != NULL) {
		        line = vctxt->inode->nodeLine;
                        col = 0;
                    } else {
                        /* This is inaccurate. */
		        line = vctxt->parserCtxt->input->line;
		        col = vctxt->parserCtxt->input->col;
                    }
		}
	    }